

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::bitmaskI64x2(Literal *__return_storage_ptr__,Literal *this)

{
  uint uVar1;
  long lVar2;
  char **ppcVar3;
  undefined1 local_48 [8];
  LaneArray<2> lanes;
  
  getLanesI64x2((LaneArray<2> *)local_48,this);
  uVar1 = 0;
  ppcVar3 = &lanes._M_elems[0].field_0.func.super_IString.str._M_str;
  lVar2 = 0;
  do {
    if (*ppcVar3 != (char *)0x3) {
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x129,"int64_t wasm::Literal::geti64() const");
    }
    uVar1 = uVar1 | (uint)((long)ppcVar3[-2] >> 0x3f) & 1 << ((byte)lVar2 & 0x1f);
    lVar2 = lVar2 + 1;
    ppcVar3 = ppcVar3 + 3;
  } while (lVar2 == 1);
  (__return_storage_ptr__->field_0).i32 = uVar1;
  (__return_storage_ptr__->type).id = 2;
  lVar2 = 0x18;
  do {
    ~Literal((Literal *)(local_48 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::bitmaskI64x2() const {
  uint32_t result = 0;
  LaneArray<2> lanes = getLanesI64x2();
  for (size_t i = 0; i < 2; ++i) {
    if (lanes[i].geti64() & (1ll << 63)) {
      result = result | (1 << i);
    }
  }
  return Literal(result);
}